

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeString(ExpressionContext *ctx,SynString *syntax)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  ExprBase *pEVar6;
  TypeArray *pTVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uchar *str;
  _func_int **pp_Var4;
  undefined4 extraout_var_00;
  
  if ((syntax->super_SynBase).field_0x3a == '\x01') {
    uVar2 = *(int *)&(syntax->value).end - *(int *)&(syntax->value).begin;
    uVar12 = 0;
    if (1 < uVar2) {
      uVar12 = (ulong)(uVar2 - 2);
    }
  }
  else {
    uVar12 = 0;
    pcVar8 = (syntax->value).begin;
    while (pcVar9 = pcVar8 + 1, pcVar9 < (syntax->value).end + -1) {
      if (pcVar8[1] == '\\') {
        pcVar9 = pcVar8 + 2;
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      pcVar8 = pcVar9;
    }
  }
  uVar2 = (uint)uVar12;
  uVar13 = (ulong)((uVar2 & 0xfffffffc) + 4);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar13);
  pp_Var4 = (_func_int **)CONCAT44(extraout_var,iVar3);
  for (uVar5 = uVar12; uVar5 < uVar13; uVar5 = uVar5 + 1) {
    *(undefined1 *)((long)pp_Var4 + uVar5) = 0;
  }
  if ((syntax->super_SynBase).field_0x3a == '\x01') {
    for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
      *(char *)((long)pp_Var4 + uVar5) = (syntax->value).begin[uVar5 + 1];
    }
  }
  else {
    pcVar8 = (syntax->value).end;
    uVar11 = 0;
    for (str = (uchar *)((syntax->value).begin + 1); str < pcVar8 + -1; str = str + lVar10) {
      uVar1 = *str;
      lVar10 = 1;
      if (uVar1 == '\\') {
        uVar1 = anon_unknown.dwarf_94284::ParseEscapeSequence
                          (ctx,&syntax->super_SynBase,(char *)str);
        lVar10 = 2;
      }
      *(uchar *)((long)pp_Var4 + (ulong)uVar11) = uVar1;
      uVar11 = uVar11 + 1;
    }
  }
  *(undefined1 *)((long)pp_Var4 + uVar12) = 0;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
  pTVar7 = ExpressionContext::GetArrayType(ctx,ctx->typeChar,(ulong)(uVar2 + 1));
  pEVar6->typeID = 5;
  pEVar6->source = &syntax->super_SynBase;
  pEVar6->type = &pTVar7->super_TypeBase;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002236b0;
  pEVar6[1]._vptr_ExprBase = pp_Var4;
  pEVar6[1].typeID = uVar2;
  return pEVar6;
}

Assistant:

ExprBase* AnalyzeString(ExpressionContext &ctx, SynString *syntax)
{
	unsigned length = 0;

	if(syntax->rawLiteral)
	{
		if(syntax->value.length() >= 2)
			length = syntax->value.length() - 2;
	}
	else
	{
		// Find the length of the string with collapsed escape-sequences
		for(const char *curr = syntax->value.begin + 1, *end = syntax->value.end - 1; curr < end; curr++, length++)
		{
			if(*curr == '\\')
				curr++;
		}
	}

	unsigned memory = length ? ((length + 1) + 3) & ~3 : 4;

	char *value = (char*)ctx.allocator->alloc(memory);

	for(unsigned i = length; i < memory; i++)
		value[i] = 0;

	if(syntax->rawLiteral)
	{
		for(unsigned i = 0; i < length; i++)
			value[i] = syntax->value.begin[i + 1];

		value[length] = 0;
	}
	else
	{
		unsigned i = 0;

		// Find the length of the string with collapsed escape-sequences
		for(const char *curr = syntax->value.begin + 1, *end = syntax->value.end - 1; curr < end;)
		{
			if(*curr == '\\')
			{
				value[i++] = ParseEscapeSequence(ctx, syntax, curr);
				curr += 2;
			}
			else
			{
				value[i++] = *curr;
				curr += 1;
			}
		}

		value[length] = 0;
	}

	return new (ctx.get<ExprStringLiteral>()) ExprStringLiteral(syntax, ctx.GetArrayType(ctx.typeChar, length + 1), value, length);
}